

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttgxvar.c
# Opt level: O1

FT_Error tt_var_load_item_variation_store(TT_Face face,FT_ULong offset,GX_ItemVarStore itemStore)

{
  FT_Stream stream;
  FT_Memory memory;
  GX_Blend pGVar1;
  bool bVar2;
  bool bVar3;
  FT_Byte FVar4;
  FT_UInt16 FVar5;
  FT_UInt16 FVar6;
  FT_UInt32 FVar7;
  uint uVar8;
  FT_Pointer P;
  GX_VarRegion pGVar9;
  GX_AxisCoords pGVar10;
  undefined6 extraout_var;
  undefined6 extraout_var_00;
  undefined6 extraout_var_01;
  GX_ItemVarData pGVar11;
  undefined6 extraout_var_02;
  FT_UInt *pFVar12;
  FT_ItemVarDelta *pFVar13;
  FT_UInt FVar14;
  int iVar15;
  GX_AxisCoords pGVar16;
  ulong uVar17;
  FT_Fixed *pFVar18;
  FT_Error error;
  FT_Error local_7c;
  ulong local_78;
  ulong local_70;
  GX_ItemVarStore local_68;
  undefined8 local_60;
  ulong local_58;
  ulong local_50;
  int local_44;
  ulong local_40;
  ulong local_38;
  
  stream = (face->root).stream;
  memory = stream->memory;
  pGVar1 = face->blend;
  local_7c = FT_Stream_Seek(stream,offset);
  if ((local_7c == 0) && (FVar5 = FT_Stream_ReadUShort(stream,&local_7c), local_7c == 0)) {
    if (FVar5 == 1) {
      FVar7 = FT_Stream_ReadULong(stream,&local_7c);
      if (local_7c == 0) {
        local_70 = CONCAT44(local_70._4_4_,FVar7);
        FVar5 = FT_Stream_ReadUShort(stream,&local_7c);
        if (local_7c == 0) {
          if (FVar5 != 0) {
            local_78 = (ulong)FVar5;
            local_40 = (ulong)FVar5;
            P = ft_mem_qrealloc(memory,8,0,local_78,(void *)0x0,&local_7c);
            if (local_7c == 0) {
              local_70 = local_70 & 0xffffffff;
              uVar17 = 0;
              local_68 = itemStore;
              do {
                FVar7 = FT_Stream_ReadULong(stream,&local_7c);
                *(ulong *)((long)P + uVar17 * 8) = (ulong)FVar7;
                if (local_7c != 0) goto LAB_00259759;
                uVar17 = uVar17 + 1;
              } while (local_78 != uVar17);
              local_7c = FT_Stream_Seek(stream,local_70 + offset);
              if (((local_7c == 0) &&
                  (FVar5 = FT_Stream_ReadUShort(stream,&local_7c), local_7c == 0)) &&
                 (FVar6 = FT_Stream_ReadUShort(stream,&local_7c), local_7c == 0)) {
                local_60 = (ulong)FVar5;
                if ((pGVar1->mmvar->num_axis == (uint)FVar5) &&
                   (local_68->axisCount = FVar5, -1 < (short)FVar6)) {
                  pGVar9 = (GX_VarRegion)
                           ft_mem_realloc(memory,8,0,(ulong)FVar6,(void *)0x0,&local_7c);
                  local_68->varRegionList = pGVar9;
                  if (local_7c == 0) {
                    local_68->regionCount = (uint)FVar6;
                    if (FVar6 != 0) {
                      local_58 = 0;
                      do {
                        pGVar10 = (GX_AxisCoords)
                                  ft_mem_realloc(memory,0x18,0,local_60,(void *)0x0,&local_7c);
                        local_68->varRegionList[local_58].axisList = pGVar10;
                        bVar3 = true;
                        if (local_7c == 0) {
                          if (local_68->axisCount != 0) {
                            pFVar18 = &pGVar10->endCoord;
                            pGVar16 = (GX_AxisCoords)0x0;
                            do {
                              FVar5 = FT_Stream_ReadUShort(stream,&local_7c);
                              pGVar10 = (GX_AxisCoords)CONCAT62(extraout_var,FVar5);
                              local_70 = CONCAT62(local_70._2_6_,FVar5);
                              bVar3 = true;
                              if (local_7c == 0) {
                                FVar5 = FT_Stream_ReadUShort(stream,&local_7c);
                                pGVar10 = (GX_AxisCoords)CONCAT62(extraout_var_00,FVar5);
                                local_50 = CONCAT62(local_50._2_6_,FVar5);
                                if (local_7c == 0) {
                                  FVar5 = FT_Stream_ReadUShort(stream,&local_7c);
                                  pGVar10 = (GX_AxisCoords)CONCAT62(extraout_var_01,FVar5);
                                  bVar2 = false;
                                  bVar3 = true;
                                  if (local_7c == 0) {
                                    ((GX_AxisCoordsRec_ *)(pFVar18 + -2))->startCoord =
                                         (long)(short)local_70 << 2;
                                    pFVar18[-1] = (long)(short)local_50 << 2;
                                    pGVar10 = (GX_AxisCoords)((long)(short)FVar5 << 2);
                                    *pFVar18 = (FT_Fixed)pGVar10;
                                    bVar2 = true;
                                    bVar3 = false;
                                  }
                                }
                                else {
                                  bVar2 = false;
                                  bVar3 = true;
                                }
                              }
                              else {
                                bVar2 = false;
                              }
                              if (!bVar2) goto LAB_00259443;
                              pGVar16 = (GX_AxisCoords)((long)&pGVar16->startCoord + 1);
                              pGVar10 = (GX_AxisCoords)(ulong)local_68->axisCount;
                              pFVar18 = pFVar18 + 3;
                            } while (pGVar16 < pGVar10);
                          }
                          bVar3 = false;
                        }
LAB_00259443:
                        if (bVar3) {
                          if (!bVar3) {
                            return (FT_Error)pGVar10;
                          }
                          goto LAB_00259759;
                        }
                        local_58 = local_58 + 1;
                      } while (local_58 < local_68->regionCount);
                    }
                    pGVar11 = (GX_ItemVarData)
                              ft_mem_realloc(memory,0x18,0,local_78,(void *)0x0,&local_7c);
                    local_68->varData = pGVar11;
                    if (local_7c == 0) {
                      FVar14 = (FT_UInt)local_40;
                      local_68->dataCount = FVar14;
                      local_40 = (ulong)(FVar14 + (FVar14 == 0));
                      local_50 = 0;
                      while( true ) {
                        pGVar11 = local_68->varData + local_50;
                        local_7c = FT_Stream_Seek(stream,*(long *)((long)P + local_50 * 8) + offset)
                        ;
                        if (local_7c != 0) break;
                        FVar5 = FT_Stream_ReadUShort(stream,&local_7c);
                        local_78 = CONCAT62(local_78._2_6_,FVar5);
                        if (local_7c != 0) break;
                        FVar5 = FT_Stream_ReadUShort(stream,&local_7c);
                        local_58 = CONCAT44(local_58._4_4_,(int)CONCAT62(extraout_var_02,FVar5));
                        if ((local_7c != 0) ||
                           (FVar5 = FT_Stream_ReadUShort(stream,&local_7c), local_7c != 0)) break;
                        local_60 = CONCAT44(local_60._4_4_,(undefined4)local_58) &
                                   0xffffffff00007fff;
                        if (FVar5 < ((ushort)local_58 & 0x7fff)) goto LAB_00259777;
                        uVar8 = (uint)FVar5;
                        local_70 = CONCAT44(local_70._4_4_,uVar8);
                        if (local_68->regionCount < uVar8) goto LAB_00259777;
                        pFVar12 = (FT_UInt *)
                                  ft_mem_realloc(memory,4,0,(ulong)uVar8,(void *)0x0,&local_7c);
                        pGVar11->regionIndices = pFVar12;
                        if (local_7c != 0) break;
                        pGVar11->regionIdxCount = (FT_UInt)local_70;
                        if ((FT_UInt)local_70 != 0) {
                          uVar17 = 0;
                          do {
                            FVar5 = FT_Stream_ReadUShort(stream,&local_7c);
                            pGVar11->regionIndices[uVar17] = (uint)FVar5;
                            if (local_7c != 0) goto LAB_00259759;
                            if (local_68->regionCount < (uint)FVar5 ||
                                local_68->regionCount == (uint)FVar5) goto LAB_00259777;
                            uVar17 = uVar17 + 1;
                          } while (uVar17 < pGVar11->regionIdxCount);
                        }
                        uVar8 = (uint)(ushort)local_78;
                        local_38 = (ulong)((FT_UInt)local_70 * uVar8);
                        pFVar13 = (FT_ItemVarDelta *)
                                  ft_mem_realloc(memory,4,0,local_38,(void *)0x0,&local_7c);
                        pGVar11->deltaSet = pFVar13;
                        if (local_7c != 0) break;
                        pGVar11->itemCount = uVar8;
                        if ((uint)local_38 != 0) {
                          local_44 = (FT_UInt)local_70 - (uint)local_60;
                          local_78 = local_78 & 0xffffffff00000000;
                          do {
                            iVar15 = (uint)local_60;
                            if ((short)local_58 < 0) {
                              if ((short)local_60 == 0) {
                                uVar8 = 0;
                              }
                              else {
                                do {
                                  FVar7 = FT_Stream_ReadULong(stream,&local_7c);
                                  pGVar11->deltaSet[local_78 & 0xffffffff] = FVar7;
                                  if (local_7c != 0) goto LAB_00259759;
                                  local_78 = CONCAT44(local_78._4_4_,(uint)local_78 + 1);
                                  iVar15 = iVar15 + -1;
                                } while (iVar15 != 0);
                                uVar8 = (uint)local_60;
                              }
                              iVar15 = local_44;
                              if (uVar8 < (FT_UInt)local_70) {
                                do {
                                  FVar5 = FT_Stream_ReadUShort(stream,&local_7c);
                                  pGVar11->deltaSet[local_78 & 0xffffffff] = (int)(short)FVar5;
                                  if (local_7c != 0) goto LAB_00259759;
                                  local_78 = CONCAT44(local_78._4_4_,(uint)local_78 + 1);
                                  iVar15 = iVar15 + -1;
                                } while (iVar15 != 0);
                              }
                            }
                            else {
                              if ((uint)local_60 == 0) {
                                uVar8 = 0;
                              }
                              else {
                                do {
                                  FVar5 = FT_Stream_ReadUShort(stream,&local_7c);
                                  pGVar11->deltaSet[local_78 & 0xffffffff] = (int)(short)FVar5;
                                  if (local_7c != 0) goto LAB_00259759;
                                  local_78 = CONCAT44(local_78._4_4_,(uint)local_78 + 1);
                                  iVar15 = iVar15 + -1;
                                } while (iVar15 != 0);
                                uVar8 = (uint)local_60;
                              }
                              iVar15 = local_44;
                              if (uVar8 < (FT_UInt)local_70) {
                                do {
                                  FVar4 = FT_Stream_ReadByte(stream,&local_7c);
                                  pGVar11->deltaSet[local_78 & 0xffffffff] = (int)(char)FVar4;
                                  if (local_7c != 0) goto LAB_00259759;
                                  local_78 = CONCAT44(local_78._4_4_,(uint)local_78 + 1);
                                  iVar15 = iVar15 + -1;
                                } while (iVar15 != 0);
                              }
                            }
                          } while ((uint)local_78 < (uint)local_38);
                        }
                        local_50 = local_50 + 1;
                        if (local_50 == local_40) break;
                      }
                    }
                  }
                }
                else {
LAB_00259777:
                  local_7c = 8;
                }
              }
            }
            goto LAB_00259759;
          }
          goto LAB_0025974e;
        }
      }
    }
    else {
LAB_0025974e:
      local_7c = 8;
    }
  }
  P = (void *)0x0;
LAB_00259759:
  ft_mem_free(memory,P);
  return local_7c;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  tt_var_load_item_variation_store( TT_Face          face,
                                    FT_ULong         offset,
                                    GX_ItemVarStore  itemStore )
  {
    FT_Stream  stream = FT_FACE_STREAM( face );
    FT_Memory  memory = stream->memory;

    FT_Error   error;
    FT_UShort  format;
    FT_ULong   region_offset;

    FT_UInt    data_count;
    FT_UShort  axis_count;
    FT_UInt    region_count;

    FT_UInt  i, j, k;
    FT_Bool  long_words;

    GX_Blend   blend           = face->blend;
    FT_ULong*  dataOffsetArray = NULL;


    if ( FT_STREAM_SEEK( offset ) ||
         FT_READ_USHORT( format ) )
      goto Exit;

    if ( format != 1 )
    {
      FT_TRACE2(( "tt_var_load_item_variation_store: bad store format %d\n",
                  format ));
      error = FT_THROW( Invalid_Table );
      goto Exit;
    }

    /* read top level fields */
    if ( FT_READ_ULONG( region_offset ) ||
         FT_READ_USHORT( data_count )   )
      goto Exit;

    /* we need at least one entry in `itemStore->varData' */
    if ( !data_count )
    {
      FT_TRACE2(( "tt_var_load_item_variation_store: missing varData\n" ));
      error = FT_THROW( Invalid_Table );
      goto Exit;
    }

    /* make temporary copy of item variation data offsets; */
    /* we will parse region list first, then come back     */
    if ( FT_QNEW_ARRAY( dataOffsetArray, data_count ) )
      goto Exit;

    for ( i = 0; i < data_count; i++ )
    {
      if ( FT_READ_ULONG( dataOffsetArray[i] ) )
        goto Exit;
    }

    /* parse array of region records (region list) */
    if ( FT_STREAM_SEEK( offset + region_offset ) )
      goto Exit;

    if ( FT_READ_USHORT( axis_count )   ||
         FT_READ_USHORT( region_count ) )
      goto Exit;

    if ( axis_count != (FT_Long)blend->mmvar->num_axis )
    {
      FT_TRACE2(( "tt_var_load_item_variation_store:"
                  " number of axes in item variation store\n" ));
      FT_TRACE2(( "                                 "
                  " and `fvar' table are different\n" ));
      error = FT_THROW( Invalid_Table );
      goto Exit;
    }
    itemStore->axisCount = axis_count;

    /* new constraint in OpenType 1.8.4 */
    if ( region_count >= 32768U )
    {
      FT_TRACE2(( "tt_var_load_item_variation_store:"
                  " too many variation region tables\n" ));
      error = FT_THROW( Invalid_Table );
      goto Exit;
    }

    if ( FT_NEW_ARRAY( itemStore->varRegionList, region_count ) )
      goto Exit;
    itemStore->regionCount = region_count;

    for ( i = 0; i < itemStore->regionCount; i++ )
    {
      GX_AxisCoords  axisCoords;


      if ( FT_NEW_ARRAY( itemStore->varRegionList[i].axisList, axis_count ) )
        goto Exit;

      axisCoords = itemStore->varRegionList[i].axisList;

      for ( j = 0; j < itemStore->axisCount; j++ )
      {
        FT_Short  start, peak, end;


        if ( FT_READ_SHORT( start ) ||
             FT_READ_SHORT( peak )  ||
             FT_READ_SHORT( end )   )
          goto Exit;

        axisCoords[j].startCoord = FT_fdot14ToFixed( start );
        axisCoords[j].peakCoord  = FT_fdot14ToFixed( peak );
        axisCoords[j].endCoord   = FT_fdot14ToFixed( end );
      }
    }

    /* end of region list parse */

    /* use dataOffsetArray now to parse varData items */
    if ( FT_NEW_ARRAY( itemStore->varData, data_count ) )
      goto Exit;
    itemStore->dataCount = data_count;

    for ( i = 0; i < data_count; i++ )
    {
      GX_ItemVarData  varData = &itemStore->varData[i];

      FT_UInt  item_count;
      FT_UInt  word_delta_count;
      FT_UInt  region_idx_count;


      if ( FT_STREAM_SEEK( offset + dataOffsetArray[i] ) )
        goto Exit;

      if ( FT_READ_USHORT( item_count )       ||
           FT_READ_USHORT( word_delta_count ) ||
           FT_READ_USHORT( region_idx_count ) )
        goto Exit;

      long_words        = !!( word_delta_count & 0x8000 );
      word_delta_count &= 0x7FFF;

      /* check some data consistency */
      if ( word_delta_count > region_idx_count )
      {
        FT_TRACE2(( "bad short count %d or region count %d\n",
                    word_delta_count,
                    region_idx_count ));
        error = FT_THROW( Invalid_Table );
        goto Exit;
      }

      if ( region_idx_count > itemStore->regionCount )
      {
        FT_TRACE2(( "inconsistent regionCount %d in varData[%d]\n",
                    region_idx_count,
                    i ));
        error = FT_THROW( Invalid_Table );
        goto Exit;
      }

      /* parse region indices */
      if ( FT_NEW_ARRAY( varData->regionIndices, region_idx_count ) )
        goto Exit;
      varData->regionIdxCount = region_idx_count;

      for ( j = 0; j < varData->regionIdxCount; j++ )
      {
        if ( FT_READ_USHORT( varData->regionIndices[j] ) )
          goto Exit;

        if ( varData->regionIndices[j] >= itemStore->regionCount )
        {
          FT_TRACE2(( "bad region index %d\n",
                      varData->regionIndices[j] ));
          error = FT_THROW( Invalid_Table );
          goto Exit;
        }
      }

      /* Parse delta set.                                                  */
      /*                                                                   */
      /* On input, deltas are (word_delta_count + region_idx_count) bytes  */
      /* each if `long_words` isn't set, and twice as much otherwise.      */
      /*                                                                   */
      /* On output, deltas are expanded to `region_idx_count` shorts each. */
      if ( FT_NEW_ARRAY( varData->deltaSet, item_count * region_idx_count ) )
        goto Exit;
      varData->itemCount = item_count;

      for ( j = 0; j < item_count * region_idx_count; )
      {
        if ( long_words )
        {
          for ( k = 0; k < word_delta_count; k++, j++ )
            if ( FT_READ_LONG( varData->deltaSet[j] ) )
              goto Exit;
          for ( ; k < region_idx_count; k++, j++ )
            if ( FT_READ_SHORT( varData->deltaSet[j] ) )
              goto Exit;
        }
        else
        {
          for ( k = 0; k < word_delta_count; k++, j++ )
            if ( FT_READ_SHORT( varData->deltaSet[j] ) )
              goto Exit;
          for ( ; k < region_idx_count; k++, j++ )
            if ( FT_READ_CHAR( varData->deltaSet[j] ) )
              goto Exit;
        }
      }
    }

  Exit:
    FT_FREE( dataOffsetArray );

    return error;
  }